

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PBuffer __thiscall DataSourceAmiga::get_sound(DataSourceAmiga *this,size_t index)

{
  bool bVar1;
  Stream *pSVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar3;
  shared_ptr<Buffer> local_c0;
  undefined1 local_b0 [8];
  ConvertorSFX2WAV convertor;
  allocator<char> local_59;
  string local_58 [32];
  Stream local_38;
  undefined1 local_30 [8];
  PBuffer data;
  size_t index_local;
  DataSourceAmiga *this_local;
  
  get_sound_data((DataSourceAmiga *)local_30,index);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    std::shared_ptr<Buffer>::shared_ptr(&local_c0,(shared_ptr<Buffer> *)local_30);
    ConvertorSFX2WAV::ConvertorSFX2WAV((ConvertorSFX2WAV *)local_b0,&local_c0,0,false);
    std::shared_ptr<Buffer>::~shared_ptr(&local_c0);
    ConvertorPCM2WAV::convert((ConvertorPCM2WAV *)this);
    convertor.level = 1;
    ConvertorSFX2WAV::~ConvertorSFX2WAV((ConvertorSFX2WAV *)local_b0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"data",&local_59);
    Log::Logger::operator[]((Logger *)&local_38,(string *)&Log::Error);
    pSVar2 = Log::Stream::operator<<(&local_38,"Sound sample with index");
    pSVar2 = Log::Stream::operator<<
                       (pSVar2,(unsigned_long *)
                               &data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
    Log::Stream::operator<<(pSVar2," not present.");
    Log::Stream::~Stream(&local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)this,(nullptr_t)0x0);
    convertor.level = 1;
  }
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_30);
  PVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
DataSourceAmiga::get_sound(size_t index) {
  PBuffer data = get_sound_data(index);
  if (!data) {
    Log::Error["data"] << "Sound sample with index" << index << " not present.";
    return nullptr;
  }

  try {
    ConvertorSFX2WAV convertor(data);
    return convertor.convert();
  } catch (...) {
    Log::Error["data"] << "Could not convert SFX clip to WAV: #" << index;
    return nullptr;
  }
}